

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::advance_setup(PeleLM *this,Real time,Real dt,int iteration,int ncycle)

{
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  pointer pSVar1;
  MultiFab *dst;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var2;
  mapped_type *pmVar3;
  double *pdVar4;
  int k;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  Box local_ec;
  Array4<double> local_d0;
  MFIter mfi;
  
  NavierStokesBase::advance_setup(&this->super_NavierStokesBase,time,dt,iteration,ncycle);
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (((this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start)->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  if (floor_species == 1) {
    amrex::MFIter::MFIter
              (&mfi,(FabArrayBase *)
                    this_00.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::tilebox(&local_ec,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,first_spec);
      lVar8 = (long)local_ec.smallend.vect[2];
      pdVar9 = (double *)
               ((lVar8 - local_d0.begin.z) * local_d0.kstride * 8 +
                ((long)local_ec.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                (long)local_ec.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8 + (long)local_d0.p
               );
      for (; pdVar4 = pdVar9, lVar12 = (long)local_ec.smallend.vect[1],
          lVar8 <= local_ec.bigend.vect[2]; lVar8 = lVar8 + 1) {
        for (; lVar12 <= local_ec.bigend.vect[1]; lVar12 = lVar12 + 1) {
          lVar6 = 9;
          pdVar10 = pdVar4;
          pdVar11 = pdVar4;
          lVar7 = (long)local_ec.smallend.vect[0];
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            do {
              while (lVar6 != 0) {
                dVar13 = *pdVar10;
                if (1.79769313486232e+308 <= dVar13) {
                  dVar13 = 1.79769313486232e+308;
                }
                if (dVar13 <= 0.0) {
                  dVar13 = 0.0;
                }
                *pdVar10 = dVar13;
                lVar6 = lVar6 + -1;
                pdVar10 = pdVar10 + local_d0.nstride;
              }
              lVar7 = lVar7 + 1;
              pdVar10 = pdVar11 + 1;
              lVar6 = 9;
              pdVar11 = pdVar10;
            } while (local_ec.bigend.vect[0] + 1 != (int)lVar7);
          }
          pdVar4 = pdVar4 + local_d0.jstride;
        }
        pdVar9 = pdVar9 + local_d0.kstride;
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
  }
  RhoH_to_Temp((MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0);
  lVar12 = 0xd0;
  for (lVar8 = 0; lVar8 < NavierStokesBase::num_state_type; lVar8 = lVar8 + 1) {
    pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    dst = *(MultiFab **)((long)&(pSVar1->domain).smallend + lVar12 + 0xffffffffffffffe8U);
    amrex::MultiFab::Copy
              (dst,*(MultiFab **)((long)&(pSVar1->domain).smallend + lVar12 + -0x10),0,0,
               (dst->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
               (dst->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
    lVar12 = lVar12 + 0xe0;
  }
  if ((this->super_NavierStokesBase).super_AmrLevel.level == 0) {
    set_htt_hmixTYP(this);
  }
  NavierStokesBase::make_rho_curr_time(&this->super_NavierStokesBase);
  if ((plot_reactions == true) && ((this->super_NavierStokesBase).super_AmrLevel.level == 0)) {
    for (uVar5 = *(uint *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                           super_AmrMesh.super_AmrInfo.field_0x8c; -1 < (int)uVar5;
        uVar5 = uVar5 - 1) {
      _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      std::__cxx11::string::string((string *)&mfi,"REACTIONS",(allocator *)&local_d0);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                             *)((long)_Var2.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                               + 0x1908),(key_type *)&mfi);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&((pmVar3->_M_t).
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                  super_FabArray<amrex::FArrayBox>,0.0);
      std::__cxx11::string::~string((string *)&mfi);
    }
  }
  return;
}

Assistant:

void
PeleLM::advance_setup (Real time,
                       Real dt,
                       int  iteration,
                       int  ncycle)
{
   NavierStokesBase::advance_setup(time, dt, iteration, ncycle);

   // Perform operations on old data before copying into New:
   // Floor species if required.
   MultiFab& S_old = get_old_data(State_Type);
   if (floor_species == 1)
   {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(S_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx     = mfi.tilebox();
         auto const& rhoY  = S_old.array(mfi,first_spec);
         amrex::ParallelFor(bx, [rhoY]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            fabMinMax( i, j, k, NUM_SPECIES, 0.0, Real_MAX, rhoY);
         });
      }
   }

   // Reset temperature
   RhoH_to_Temp(S_old);

   // Copy States Old -> New
   for (int k = 0; k < num_state_type; k++)
   {
      MultiFab& nstate = get_new_data(k);
      const MultiFab& ostate = get_old_data(k);
      MultiFab::Copy(nstate,ostate,0,0,nstate.nComp(),nstate.nGrow());
   }
   if (level == 0) {
      set_htt_hmixTYP();
   }

   // Make rho_new in NSB, rho_old already done in NSB::advance_setup
   make_rho_curr_time();

   if (plot_reactions && level == 0)
   {
      for (int i = parent->finestLevel(); i >= 0; --i)
         getLevel(i).auxDiag["REACTIONS"]->setVal(0);
   }
}